

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler.c
# Opt level: O1

void WebPRescalerImportRowExpand_C(WebPRescaler *wrk,uint8_t *src)

{
  byte bVar1;
  uint uVar2;
  rescaler_t *prVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  rescaler_t *prVar14;
  
  uVar2 = wrk->num_channels;
  lVar5 = (long)(int)uVar2;
  if (0 < lVar5) {
    iVar6 = wrk->dst_width * uVar2;
    prVar3 = wrk->frow;
    lVar9 = 0;
    uVar10 = uVar2;
    do {
      bVar1 = src[lVar9];
      uVar7 = (uint)bVar1;
      uVar8 = (uint)bVar1;
      if (1 < wrk->src_width) {
        uVar8 = (uint)src[lVar9 + lVar5];
      }
      iVar13 = wrk->x_add;
      prVar3[lVar9] = (bVar1 - uVar8) * iVar13 + wrk->x_add * uVar8;
      if ((int)(uVar2 + (int)lVar9) < iVar6) {
        prVar14 = prVar3 + uVar10;
        iVar11 = uVar2 + (int)lVar9;
        uVar12 = uVar10;
        do {
          iVar13 = iVar13 - wrk->x_sub;
          uVar4 = uVar8;
          if (iVar13 < 0) {
            iVar11 = iVar11 + uVar2;
            iVar13 = iVar13 + wrk->x_add;
            uVar4 = (uint)src[iVar11];
            uVar7 = uVar8;
          }
          uVar8 = uVar4;
          *prVar14 = (uVar7 - uVar8) * iVar13 + wrk->x_add * uVar8;
          prVar14 = prVar14 + lVar5;
          uVar12 = uVar12 + uVar2;
        } while ((int)uVar12 < iVar6);
      }
      lVar9 = lVar9 + 1;
      uVar10 = uVar10 + 1;
    } while (lVar9 != lVar5);
  }
  return;
}

Assistant:

void WebPRescalerImportRowExpand_C(WebPRescaler* const wrk,
                                   const uint8_t* src) {
  const int x_stride = wrk->num_channels;
  const int x_out_max = wrk->dst_width * wrk->num_channels;
  int channel;
  assert(!WebPRescalerInputDone(wrk));
  assert(wrk->x_expand);
  for (channel = 0; channel < x_stride; ++channel) {
    int x_in = channel;
    int x_out = channel;
    // simple bilinear interpolation
    int accum = wrk->x_add;
    rescaler_t left = (rescaler_t)src[x_in];
    rescaler_t right =
        (wrk->src_width > 1) ? (rescaler_t)src[x_in + x_stride] : left;
    x_in += x_stride;
    while (1) {
      wrk->frow[x_out] = right * wrk->x_add + (left - right) * accum;
      x_out += x_stride;
      if (x_out >= x_out_max) break;
      accum -= wrk->x_sub;
      if (accum < 0) {
        left = right;
        x_in += x_stride;
        assert(x_in < wrk->src_width * x_stride);
        right = (rescaler_t)src[x_in];
        accum += wrk->x_add;
      }
    }
    assert(wrk->x_sub == 0 /* <- special case for src_width=1 */ || accum == 0);
  }
}